

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_11600e9::HandleHexCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  size_type sVar6;
  string_view value;
  string output;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  pointer local_40;
  cmExecutionStatus *local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar5 == 0x60) {
    local_60 = local_50;
    local_38 = status;
    std::__cxx11::string::_M_construct((ulong)&local_60,(char)pbVar1[1]._M_string_length * '\x02');
    local_40 = pbVar1 + 2;
    sVar2 = pbVar1[1]._M_string_length;
    if (sVar2 != 0) {
      pcVar3 = pbVar1[1]._M_dataplus._M_p;
      sVar6 = 0;
      lVar4 = 0;
      do {
        snprintf((char *)((long)local_60 + lVar4),3,"%.2x",(ulong)(byte)pcVar3[sVar6]);
        lVar4 = lVar4 + 2;
        sVar6 = sVar6 + 1;
      } while (sVar2 != sVar6);
    }
    value._M_str = (char *)local_60;
    value._M_len = local_58;
    cmMakefile::AddDefinition(local_38->Makefile,local_40,value);
    if (local_60 == local_50) goto LAB_0034dedf;
  }
  else {
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_60 == local_50) goto LAB_0034dedf;
  }
  operator_delete(local_60,local_50[0] + 1);
LAB_0034dedf:
  return lVar5 == 0x60;
}

Assistant:

bool HandleHexCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("Incorrect number of arguments");
    return false;
  }
  auto const& instr = args[1];
  auto const& outvar = args[2];
  std::string output(instr.size() * 2, ' ');

  std::string::size_type hexIndex = 0;
  for (auto const& c : instr) {
    snprintf(&output[hexIndex], 3, "%.2x",
             static_cast<unsigned char>(c) & 0xFF);
    hexIndex += 2;
  }

  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}